

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip-test.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_0::MockAsyncOutputStream::write
          (MockAsyncOutputStream *this,int __fd,void *__buf,size_t __n)

{
  void *__src;
  size_t __n_00;
  long lVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  long lVar3;
  ulong uVar4;
  void *__dest;
  undefined8 *puVar5;
  ArrayPtr<const_unsigned_char> *piece;
  _func_int **local_40;
  uchar *puStack_38;
  
  lVar3 = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
    puVar5 = (undefined8 *)(__n * 0x10 + (long)__buf);
    do {
      __src = *__buf;
      __n_00 = *(size_t *)((long)__buf + 8);
      lVar1 = *(long *)(lVar3 + 8);
      uVar2 = (*(long *)(lVar3 + 0x10) - lVar1) + __n_00;
      uVar4 = *(long *)(lVar3 + 0x18) - lVar1;
      if (uVar4 < uVar2) {
        uVar4 = uVar4 * 2;
        if (*(long *)(lVar3 + 0x18) == lVar1) {
          uVar4 = 4;
        }
        if (uVar4 < uVar2) {
          uVar4 = uVar2;
        }
        Vector<unsigned_char>::setCapacity((Vector<unsigned_char> *)(lVar3 + 8),uVar4);
      }
      __dest = *(void **)(lVar3 + 0x10);
      if (__n_00 != 0) {
        memcpy(__dest,__src,__n_00);
        __dest = (void *)((long)__dest + __n_00);
      }
      *(void **)(lVar3 + 0x10) = __dest;
      __buf = (void *)((long)__buf + 0x10);
    } while ((undefined8 *)__buf != puVar5);
  }
  heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_40);
  (this->super_AsyncOutputStream)._vptr_AsyncOutputStream = local_40;
  (this->bytes).builder.ptr = puStack_38;
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    for (auto& piece: pieces) {
      bytes.addAll(piece);
    }
    return kj::READY_NOW;
  }